

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutomationBasic.cpp
# Opt level: O0

void __thiscall AutomationBasic::reread(AutomationBasic *this)

{
  bool bVar1;
  uint uVar2;
  pointer pPVar3;
  undefined8 uVar4;
  Value *this_00;
  reference_wrapper *prVar5;
  Mapping *this_01;
  KeyValue *this_02;
  reference __args;
  undefined8 uVar6;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  float *pfVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  reference pvVar12;
  char *in_RCX;
  nfds_t __nfds;
  uint uVar13;
  string_view sVar14;
  undefined1 local_378 [8];
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float_4;
  ExpectedRef<const_std::string,_std::string> float_string_4;
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float_3;
  ExpectedRef<const_std::string,_std::string> float_string_3;
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float_2;
  ExpectedRef<const_std::string,_std::string> float_string_2;
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float_1;
  ExpectedRef<const_std::string,_std::string> float_string_1;
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float;
  ExpectedRef<const_std::string,_std::string> float_string;
  Keypoint kp;
  int yrow_components;
  Sequence *yrow;
  ExpectedRef<const_Sequence,_std::string> row;
  Value *it;
  const_iterator __end2;
  const_iterator __begin2;
  Sequence *__range2;
  Sequence *yseq;
  Variable variable;
  ExpectedRef<const_Sequence,_std::string> sequence;
  string *var;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>
  *kv;
  const_iterator __end1;
  const_iterator __begin1;
  KeyValue *__range1;
  Mapping *ymap;
  Data new_data;
  ExpectedRef<const_Mapping,_std::string> map;
  yaml *local_98;
  char *local_90;
  undefined1 local_88 [8];
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed;
  AutomationBasic *this_local;
  
  parsed._112_8_ = this;
  pPVar3 = std::unique_ptr<PolledFile,_std::default_delete<PolledFile>_>::operator->(&this->source_)
  ;
  uVar13 = this->seq_ + 1;
  this->seq_ = uVar13;
  uVar13 = PolledFile::poll(pPVar3,(pollfd *)(ulong)uVar13,__nfds,(int)in_RCX);
  if ((uVar13 & 1) != 0) {
    pPVar3 = std::unique_ptr<PolledFile,_std::default_delete<PolledFile>_>::operator->
                       (&this->source_);
    sVar14 = PolledFile::string(pPVar3);
    local_98 = (yaml *)sVar14._M_len;
    local_90 = sVar14._M_str;
    sVar14._M_str = in_RCX;
    sVar14._M_len = (size_t)local_90;
    yaml::parse_abi_cxx11_
              ((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_88,local_98,sVar14);
    bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_88);
    if (bVar1) {
      this_00 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator->((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_88);
      yaml::Value::getMapping_abi_cxx11_
                ((ExpectedRef<const_Mapping,_std::string> *)
                 &new_data._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00);
      bVar1 = ::Expected::operator_cast_to_bool
                        ((Expected *)&new_data._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar1) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
               *)&ymap);
        prVar5 = (reference_wrapper *)
                 Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&new_data._M_t._M_impl.super__Rb_tree_header._M_node_count);
        this_01 = std::reference_wrapper::operator_cast_to_Mapping_(prVar5);
        this_02 = yaml::Mapping::map_abi_cxx11_(this_01);
        __end1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                 ::begin(this_02);
        kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                ::end(this_02);
        while (bVar1 = std::operator!=(&__end1,(_Self *)&kv), bVar1) {
          __args = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>
                   ::operator*(&__end1);
          yaml::Value::getSequence_abi_cxx11_
                    ((ExpectedRef<const_Sequence,_std::string> *)
                     &variable.sequence.
                      super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&__args->second);
          bVar1 = ::Expected::operator_cast_to_bool
                            ((Expected *)
                             &variable.sequence.
                              super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            yseq._0_4_ = 0;
            variable.components = 0;
            variable._4_4_ = 0;
            variable.sequence.
            super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            variable.sequence.
            super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            std::vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>::
            vector((vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_> *)
                   &variable);
            prVar5 = (reference_wrapper *)
                     Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&variable.sequence.
                                 super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar7 = std::reference_wrapper::operator_cast_to_vector_(prVar5);
            __end2 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::begin(pvVar7);
            it = (Value *)std::vector<yaml::Value,_std::allocator<yaml::Value>_>::end(pvVar7);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<const_yaml::Value_*,_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
                                               *)&it), bVar1) {
              row._32_8_ = __gnu_cxx::
                           __normal_iterator<const_yaml::Value_*,_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
                           ::operator*(&__end2);
              yaml::Value::getSequence_abi_cxx11_
                        ((ExpectedRef<const_Sequence,_std::string> *)&yrow,(Value *)row._32_8_);
              bVar1 = ::Expected::operator_cast_to_bool((Expected *)&yrow);
              if (bVar1) {
                prVar5 = (reference_wrapper *)
                         Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&yrow);
                pvVar7 = std::reference_wrapper::operator_cast_to_vector_(prVar5);
                sVar8 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size(pvVar7);
                if (sVar8 < 2) {
                  uVar4 = std::__cxx11::string::c_str();
                  aAppDebugPrintf("Error parsing %s row: should be at least [t, x]",uVar4);
                  bVar1 = true;
                }
                else {
                  sVar8 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size(pvVar7);
                  if (sVar8 < 6) {
                    sVar8 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size(pvVar7);
                    uVar2 = (int)sVar8 - 1;
                    uVar13 = uVar2;
                    if (((uint)yseq == 0) || (uVar13 = (uint)yseq, (uint)yseq == uVar2)) {
                      yseq._0_4_ = uVar13;
                      memset(&float_string.has_value_,0,0x14);
                      pvVar9 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::operator[]
                                         (pvVar7,0);
                      yaml::Value::getString_abi_cxx11_
                                ((ExpectedRef<const_std::string,_std::string> *)
                                 &parsed_float.has_value_,pvVar9);
                      bVar1 = ::Expected::operator_cast_to_bool
                                        ((Expected *)&parsed_float.has_value_);
                      if (bVar1) {
                        prVar5 = (reference_wrapper *)
                                 Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&parsed_float.has_value_);
                        pbVar11 = std::reference_wrapper::operator_cast_to_string_(prVar5);
                        floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&float_string_1.has_value_,pbVar11);
                        bVar1 = ::Expected::operator_cast_to_bool
                                          ((Expected *)&float_string_1.has_value_);
                        if (bVar1) {
                          pfVar10 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::value((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&float_string_1.has_value_);
                          float_string._32_4_ = *pfVar10;
                        }
                        else {
                          uVar4 = std::__cxx11::string::c_str();
                          Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::error((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&float_string_1.has_value_);
                          uVar6 = std::__cxx11::string::c_str();
                          aAppDebugPrintf("Error parsing %s row time: %s",uVar4,uVar6);
                        }
                        bVar1 = !bVar1;
                        Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~Expected((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&float_string_1.has_value_);
                      }
                      else {
                        uVar4 = std::__cxx11::string::c_str();
                        Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&parsed_float.has_value_);
                        uVar6 = std::__cxx11::string::c_str();
                        aAppDebugPrintf("Error parsing %s row time: %s",uVar4,uVar6);
                        bVar1 = true;
                      }
                      Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&parsed_float.has_value_);
                      if (!bVar1) {
                        pvVar9 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::operator[]
                                           (pvVar7,1);
                        yaml::Value::getString_abi_cxx11_
                                  ((ExpectedRef<const_std::string,_std::string> *)
                                   &parsed_float_1.has_value_,pvVar9);
                        bVar1 = ::Expected::operator_cast_to_bool
                                          ((Expected *)&parsed_float_1.has_value_);
                        if (bVar1) {
                          prVar5 = (reference_wrapper *)
                                   Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&parsed_float_1.has_value_);
                          pbVar11 = std::reference_wrapper::operator_cast_to_string_(prVar5);
                          floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&float_string_2.has_value_,pbVar11);
                          bVar1 = ::Expected::operator_cast_to_bool
                                            ((Expected *)&float_string_2.has_value_);
                          if (bVar1) {
                            pfVar10 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::value((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&float_string_2.has_value_);
                            float_string._36_4_ = *pfVar10;
                          }
                          else {
                            uVar4 = std::__cxx11::string::c_str();
                            Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&float_string_2.has_value_);
                            uVar6 = std::__cxx11::string::c_str();
                            aAppDebugPrintf("Error parsing %s row x: %s",uVar4,uVar6);
                          }
                          bVar1 = !bVar1;
                          Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~Expected((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&float_string_2.has_value_);
                        }
                        else {
                          uVar4 = std::__cxx11::string::c_str();
                          Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&parsed_float_1.has_value_);
                          uVar6 = std::__cxx11::string::c_str();
                          aAppDebugPrintf("Error parsing %s row x: %s",uVar4,uVar6);
                          bVar1 = true;
                        }
                        Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&parsed_float_1.has_value_);
                        if (!bVar1) {
                          sVar8 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size
                                            (pvVar7);
                          if (2 < sVar8) {
                            pvVar9 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::
                                     operator[](pvVar7,2);
                            yaml::Value::getString_abi_cxx11_
                                      ((ExpectedRef<const_std::string,_std::string> *)
                                       &parsed_float_2.has_value_,pvVar9);
                            bVar1 = ::Expected::operator_cast_to_bool
                                              ((Expected *)&parsed_float_2.has_value_);
                            if (bVar1) {
                              prVar5 = (reference_wrapper *)
                                       Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&parsed_float_2.has_value_);
                              pbVar11 = std::reference_wrapper::operator_cast_to_string_(prVar5);
                              floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&float_string_3.has_value_,pbVar11);
                              bVar1 = ::Expected::operator_cast_to_bool
                                                ((Expected *)&float_string_3.has_value_);
                              if (bVar1) {
                                Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::value((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&float_string_3.has_value_);
                              }
                              else {
                                uVar4 = std::__cxx11::string::c_str();
                                Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::error((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&float_string_3.has_value_);
                                uVar6 = std::__cxx11::string::c_str();
                                aAppDebugPrintf("Error parsing %s row y: %s",uVar4,uVar6);
                              }
                              bVar1 = !bVar1;
                              Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~Expected((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&float_string_3.has_value_);
                            }
                            else {
                              uVar4 = std::__cxx11::string::c_str();
                              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&parsed_float_2.has_value_);
                              uVar6 = std::__cxx11::string::c_str();
                              aAppDebugPrintf("Error parsing %s row y: %s",uVar4,uVar6);
                              bVar1 = true;
                            }
                            Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&parsed_float_2.has_value_);
                            if (bVar1) goto LAB_0010edd4;
                          }
                          sVar8 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size
                                            (pvVar7);
                          if (3 < sVar8) {
                            pvVar9 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::
                                     operator[](pvVar7,3);
                            yaml::Value::getString_abi_cxx11_
                                      ((ExpectedRef<const_std::string,_std::string> *)
                                       &parsed_float_3.has_value_,pvVar9);
                            bVar1 = ::Expected::operator_cast_to_bool
                                              ((Expected *)&parsed_float_3.has_value_);
                            if (bVar1) {
                              prVar5 = (reference_wrapper *)
                                       Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&parsed_float_3.has_value_);
                              pbVar11 = std::reference_wrapper::operator_cast_to_string_(prVar5);
                              floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&float_string_4.has_value_,pbVar11);
                              bVar1 = ::Expected::operator_cast_to_bool
                                                ((Expected *)&float_string_4.has_value_);
                              if (bVar1) {
                                Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::value((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&float_string_4.has_value_);
                              }
                              else {
                                uVar4 = std::__cxx11::string::c_str();
                                Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::error((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&float_string_4.has_value_);
                                uVar6 = std::__cxx11::string::c_str();
                                aAppDebugPrintf("Error parsing %s row z: %s",uVar4,uVar6);
                              }
                              bVar1 = !bVar1;
                              Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~Expected((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&float_string_4.has_value_);
                            }
                            else {
                              uVar4 = std::__cxx11::string::c_str();
                              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&parsed_float_3.has_value_);
                              uVar6 = std::__cxx11::string::c_str();
                              aAppDebugPrintf("Error parsing %s row z: %s",uVar4,uVar6);
                              bVar1 = true;
                            }
                            Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&parsed_float_3.has_value_);
                            if (bVar1) goto LAB_0010edd4;
                          }
                          sVar8 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size
                                            (pvVar7);
                          if (4 < sVar8) {
                            pvVar9 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::
                                     operator[](pvVar7,4);
                            yaml::Value::getString_abi_cxx11_
                                      ((ExpectedRef<const_std::string,_std::string> *)
                                       &parsed_float_4.has_value_,pvVar9);
                            bVar1 = ::Expected::operator_cast_to_bool
                                              ((Expected *)&parsed_float_4.has_value_);
                            if (bVar1) {
                              prVar5 = (reference_wrapper *)
                                       Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&parsed_float_4.has_value_);
                              pbVar11 = std::reference_wrapper::operator_cast_to_string_(prVar5);
                              floatFromString((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_378,pbVar11);
                              bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_378);
                              if (bVar1) {
                                Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::value((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_378);
                              }
                              else {
                                uVar4 = std::__cxx11::string::c_str();
                                Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::error((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_378);
                                uVar6 = std::__cxx11::string::c_str();
                                aAppDebugPrintf("Error parsing %s row w: %s",uVar4,uVar6);
                              }
                              bVar1 = !bVar1;
                              Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~Expected((Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_378);
                            }
                            else {
                              uVar4 = std::__cxx11::string::c_str();
                              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&parsed_float_4.has_value_);
                              uVar6 = std::__cxx11::string::c_str();
                              aAppDebugPrintf("Error parsing %s row w: %s",uVar4,uVar6);
                              bVar1 = true;
                            }
                            Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&parsed_float_4.has_value_);
                            if (bVar1) goto LAB_0010edd4;
                          }
                          bVar1 = std::
                                  vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                                  ::empty((vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                                           *)&variable);
                          if ((bVar1) ||
                             (pvVar12 = std::
                                        vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                                        ::back((vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                                                *)&variable),
                             pvVar12->row <= (float)float_string._32_4_)) {
                            std::
                            vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                            ::push_back((vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                                         *)&variable,(value_type *)&float_string.has_value_);
                            bVar1 = false;
                          }
                          else {
                            uVar4 = std::__cxx11::string::c_str();
                            aAppDebugPrintf("Error parsing %s rows: monotonic time expected",uVar4);
                            bVar1 = true;
                          }
                        }
                      }
                    }
                    else {
                      uVar4 = std::__cxx11::string::c_str();
                      aAppDebugPrintf("Error parsing %s row: inconsistent number of components %d, %d expected"
                                      ,uVar4,(ulong)uVar2,(ulong)(uint)yseq);
                      bVar1 = true;
                    }
                  }
                  else {
                    uVar4 = std::__cxx11::string::c_str();
                    sVar8 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size(pvVar7);
                    aAppDebugPrintf("Error parsing %s row: too many components %d, max 4",uVar4,
                                    sVar8 & 0xffffffff);
                    bVar1 = true;
                  }
                }
              }
              else {
                uVar4 = std::__cxx11::string::c_str();
                Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::error((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&yrow);
                uVar6 = std::__cxx11::string::c_str();
                aAppDebugPrintf("Error parsing %s row: %s",uVar4,uVar6);
                bVar1 = true;
              }
LAB_0010edd4:
              Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&yrow);
              if (bVar1) goto LAB_0010ee75;
              __gnu_cxx::
              __normal_iterator<const_yaml::Value_*,_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
              ::operator++(&__end2);
            }
            bVar1 = std::
                    vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>::
                    empty((vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                           *)&variable);
            if (!bVar1) {
              std::
              map<std::__cxx11::string,AutomationBasic::Variable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
              ::emplace<std::__cxx11::string_const,AutomationBasic::Variable>
                        ((map<std::__cxx11::string,AutomationBasic::Variable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
                          *)&ymap,&__args->first,(Variable *)&yseq);
            }
            bVar1 = false;
LAB_0010ee75:
            Variable::~Variable((Variable *)&yseq);
          }
          else {
            uVar4 = std::__cxx11::string::c_str();
            Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&variable.sequence.
                        super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            uVar6 = std::__cxx11::string::c_str();
            aAppDebugPrintf("Error parsing %s: %s",uVar4,uVar6);
            bVar1 = true;
          }
          Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&variable.sequence.
                          super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) goto LAB_0010eee7;
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>
          ::operator++(&__end1);
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::operator=(&this->data_,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
                     *)&ymap);
LAB_0010eee7:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
                *)&ymap);
      }
      else {
        Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&new_data._M_t._M_impl.super__Rb_tree_header._M_node_count);
        uVar4 = std::__cxx11::string::c_str();
        aAppDebugPrintf("Automation must start with mapping: %s",uVar4);
      }
      Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&new_data._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::error((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_88);
      uVar4 = std::__cxx11::string::c_str();
      aAppDebugPrintf("Automation parsing failed: %s",uVar4);
    }
    Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_88);
  }
  return;
}

Assistant:

void AutomationBasic::reread() {
	if (!source_->poll(++seq_))
		return;

	auto parsed = yaml::parse(source_->string());
	if (!parsed) {
		MSG("Automation parsing failed: %s", parsed.error().c_str());
		return;
	}
	auto map = parsed->getMapping();
	if (!map) {
		MSG("Automation must start with mapping: %s", map.error().c_str());
		return;
	}

	Data new_data;

	const yaml::Mapping &ymap = map.value();
	for(const auto &kv: ymap.map()) {
		const std::string &var = kv.first;
		auto sequence = kv.second.getSequence();
		if (!sequence) {
			MSG("Error parsing %s: %s", var.c_str(), sequence.error().c_str());
			return;
		}

		Variable variable = {0, {}};

		const yaml::Sequence &yseq = sequence.value();
		for (const auto &it: yseq) {
			auto row = it.getSequence();
			if (!row) {
				MSG("Error parsing %s row: %s", var.c_str(), row.error().c_str());
				return;
			}

			const yaml::Sequence &yrow = row.value();
			if (yrow.size() < 2) {
				MSG("Error parsing %s row: should be at least [t, x]", var.c_str());
				return;
			}

#define READ_FLOAT(i, name, to) \
			do { \
				auto float_string = yrow[i].getString(); \
				if (!float_string) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), float_string.error().c_str()); \
					return; \
				} \
				auto parsed_float = floatFromString(float_string.value()); \
				if (!parsed_float) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), parsed_float.error().c_str()); \
					return; \
				} \
				to = parsed_float.value(); \
			} while(0)

			if (yrow.size() > 5) {
				MSG("Error parsing %s row: too many components %d, max 4", var.c_str(), static_cast<int>(yrow.size()));
				return;
			}

			const int yrow_components = static_cast<int>(yrow.size() - 1);
			if (variable.components == 0) {
				variable.components = yrow_components;
			} else if (variable.components != yrow_components) {
				MSG("Error parsing %s row: inconsistent number of components %d, %d expected",
					var.c_str(), yrow_components, variable.components);
				return;
			}

			Keypoint kp = {0,{0,0,0,0}};
			READ_FLOAT(0, time, kp.row);
			READ_FLOAT(1, x, kp.value.x);
			if (yrow.size() > 2) READ_FLOAT(2, y, kp.value.y);
			if (yrow.size() > 3) READ_FLOAT(3, z, kp.value.z);
			if (yrow.size() > 4) READ_FLOAT(4, w, kp.value.w);

			if (!variable.sequence.empty() && variable.sequence.back().row > kp.row) {
				MSG("Error parsing %s rows: monotonic time expected", var.c_str());
				return;
			}

			variable.sequence.push_back(kp);
		}

		if (!variable.sequence.empty())
			new_data.emplace(std::move(var), std::move(variable));
	}

	data_ = std::move(new_data);
}